

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O0

void BinaryCache::LastBytecode(char *bytecode)

{
  uint uVar1;
  uint size;
  char *bytecode_local;
  
  uVar1 = *(uint *)bytecode;
  if (lastReserved < uVar1) {
    if (lastBytecode != (void *)0x0) {
      operator_delete__(lastBytecode);
    }
    lastReserved = uVar1 + (uVar1 >> 1);
    lastBytecode = operator_new__((ulong)lastReserved);
  }
  memcpy(lastBytecode,bytecode,(ulong)uVar1);
  return;
}

Assistant:

void BinaryCache::LastBytecode(const char* bytecode)
{
	unsigned int size = *(unsigned int*)bytecode;
	if(size > lastReserved)
	{
		delete[] lastBytecode;
		lastReserved = size + (size >> 1);
		lastBytecode = new char[lastReserved];
	}
	memcpy(lastBytecode, bytecode, size);
}